

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
          (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *this)

{
  Data *pDVar1;
  pair<QPersistentModelIndex,_unsigned_int> *this_00;
  long lVar2;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (this->size != 0) {
        this_00 = this->ptr;
        lVar2 = this->size << 4;
        do {
          QPersistentModelIndex::~QPersistentModelIndex(&this_00->first);
          this_00 = this_00 + 1;
          lVar2 = lVar2 + -0x10;
        } while (lVar2 != 0);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x10,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }